

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

tmsize_t TIFFReadEncodedStripGetStripSize(TIFF *tif,uint32_t strip,uint16_t *pplane)

{
  int iVar1;
  uint uVar2;
  tmsize_t stripsize;
  uint32_t rows;
  uint32_t stripinplane;
  uint32_t stripsperplane;
  uint32_t rowsperstrip;
  TIFFDirectory *td;
  uint16_t *pplane_local;
  uint32_t strip_local;
  TIFF *tif_local;
  
  iVar1 = TIFFCheckRead(tif,0);
  if (iVar1 == 0) {
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  else if (strip < (tif->tif_dir).td_nstrips) {
    stripinplane = (tif->tif_dir).td_rowsperstrip;
    if ((tif->tif_dir).td_imagelength < stripinplane) {
      stripinplane = (tif->tif_dir).td_imagelength;
    }
    uVar2 = (tif->tif_dir).td_imagelength / stripinplane +
            (uint)((tif->tif_dir).td_imagelength % stripinplane != 0);
    if (pplane != (uint16_t *)0x0) {
      *pplane = (uint16_t)(strip / uVar2);
    }
    stripsize._0_4_ = (tif->tif_dir).td_imagelength - (strip % uVar2) * stripinplane;
    if (stripinplane < (uint)stripsize) {
      stripsize._0_4_ = stripinplane;
    }
    tif_local = (TIFF *)TIFFVStripSize(tif,(uint)stripsize);
    if (tif_local == (TIFF *)0x0) {
      tif_local = (TIFF *)0xffffffffffffffff;
    }
  }
  else {
    TIFFErrorExtR(tif,"TIFFReadEncodedStrip","%u: Strip out of range, max %u",(ulong)strip,
                  (ulong)(tif->tif_dir).td_nstrips);
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  return (tmsize_t)tif_local;
}

Assistant:

static tmsize_t TIFFReadEncodedStripGetStripSize(TIFF *tif, uint32_t strip,
                                                 uint16_t *pplane)
{
    static const char module[] = "TIFFReadEncodedStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t rowsperstrip;
    uint32_t stripsperplane;
    uint32_t stripinplane;
    uint32_t rows;
    tmsize_t stripsize;
    if (!TIFFCheckRead(tif, 0))
        return ((tmsize_t)(-1));
    if (strip >= td->td_nstrips)
    {
        TIFFErrorExtR(tif, module,
                      "%" PRIu32 ": Strip out of range, max %" PRIu32, strip,
                      td->td_nstrips);
        return ((tmsize_t)(-1));
    }

    rowsperstrip = td->td_rowsperstrip;
    if (rowsperstrip > td->td_imagelength)
        rowsperstrip = td->td_imagelength;
    stripsperplane =
        TIFFhowmany_32_maxuint_compat(td->td_imagelength, rowsperstrip);
    stripinplane = (strip % stripsperplane);
    if (pplane)
        *pplane = (uint16_t)(strip / stripsperplane);
    rows = td->td_imagelength - stripinplane * rowsperstrip;
    if (rows > rowsperstrip)
        rows = rowsperstrip;
    stripsize = TIFFVStripSize(tif, rows);
    if (stripsize == 0)
        return ((tmsize_t)(-1));
    return stripsize;
}